

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_vote.cxx
# Opt level: O3

void __thiscall nuraft::raft_server::handle_prevote_resp(raft_server *this,resp_msg *resp)

{
  atomic<bool> *paVar1;
  atomic<int> *paVar2;
  int *piVar3;
  srv_role sVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  element_type *peVar8;
  context *pcVar9;
  int32 iVar10;
  int iVar11;
  uint uVar12;
  int32_t *piVar13;
  long lVar14;
  char *pcVar15;
  bool bVar16;
  Param param;
  Param *local_78;
  undefined8 local_70;
  Param local_68;
  element_type *local_50;
  ulong local_48;
  ulong local_40;
  Type local_34;
  
  if ((resp->super_msg_base).term_ == (this->pre_vote_).term_) {
    lVar14 = 0xd8;
    if (resp->accepted_ == false) {
      lVar14 = (ulong)(resp->next_idx_ == 0xffffffffffffffff) * 8 + 0xd4;
    }
    LOCK();
    piVar3 = (int *)((long)&this->_vptr_raft_server + lVar14);
    *piVar3 = *piVar3 + 1;
    UNLOCK();
    iVar10 = get_quorum_for_election(this);
    peVar8 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar8 != (element_type *)0x0) && (iVar11 = (*peVar8->_vptr_logger[7])(), 3 < iVar11)) {
      local_50 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_68.ctx._4_4_ = (resp->super_msg_base).src_;
      bVar16 = resp->accepted_;
      local_40 = (this->pre_vote_).term_;
      local_48 = (resp->super_msg_base).term_;
      sVar4 = (this->role_)._M_i;
      local_78 = &local_68;
      if (sVar4 == leader) {
        piVar13 = (int32_t *)((long)&local_68.leaderId + 2);
        local_68._0_6_ = 0x726500000000;
        local_68.myId = 0x6461656c;
        local_70 = 6;
      }
      else if (sVar4 == candidate) {
        piVar13 = (int32_t *)((long)&local_68.peerId + 1);
        local_68.myId = 0x646e6163;
        local_68.leaderId = 0x74616469;
        local_68.peerId._0_1_ = 0x65;
        local_70 = 9;
      }
      else if (sVar4 == follower) {
        piVar13 = &local_68.peerId;
        local_68.myId = 0x6c6c6f66;
        local_68.leaderId = 0x7265776f;
        local_70 = 8;
      }
      else {
        piVar13 = (int32_t *)((long)&local_68.leaderId + 3);
        local_68._0_7_ = 0x4e574f4e000000;
        local_68.myId = 0x4e4b4e55;
        local_70 = 7;
      }
      *(undefined1 *)piVar13 = 0;
      uVar5 = (this->pre_vote_).dead_.super___atomic_base<int>._M_i;
      uVar6 = (this->pre_vote_).live_.super___atomic_base<int>._M_i;
      uVar7 = (this->pre_vote_).abandoned_.super___atomic_base<int>._M_i;
      uVar12 = get_num_voting_members(this);
      pcVar15 = "X";
      if (bVar16 != false) {
        pcVar15 = "O";
      }
      msg_if_given_abi_cxx11_
                ((string *)&param,
                 "[PRE-VOTE RESP] peer %d (%s), term %lu, resp term %lu, my role %s, dead %d, live %d, abandoned %d, num voting members %d, quorum %d\n"
                 ,(ulong)local_68.ctx._4_4_,pcVar15,local_40,local_48,&local_68,(ulong)uVar5,
                 (ulong)uVar6,(ulong)uVar7,(ulong)uVar12,(ulong)(iVar10 + 1));
      (*local_50->_vptr_logger[8])
                (local_50,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                 ,"handle_prevote_resp",0x1df,&param);
      if ((void **)CONCAT44(param.leaderId,param.myId) != &param.ctx) {
        operator_delete((undefined1 *)CONCAT44(param.leaderId,param.myId));
      }
      if (local_78 != &local_68) {
        operator_delete(local_78);
      }
    }
    if (iVar10 < (this->pre_vote_).dead_.super___atomic_base<int>._M_i) {
      peVar8 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar8 != (element_type *)0x0) && (iVar11 = (*peVar8->_vptr_logger[7])(), 3 < iVar11)) {
        peVar8 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)&param,"[PRE-VOTE DONE] SUCCESS, term %lu",(this->pre_vote_).term_);
        (*peVar8->_vptr_logger[8])
                  (peVar8,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                   ,"handle_prevote_resp",0x1e2,&param);
        if ((void **)CONCAT44(param.leaderId,param.myId) != &param.ctx) {
          operator_delete((undefined1 *)CONCAT44(param.leaderId,param.myId));
        }
      }
      paVar1 = &(this->pre_vote_).done_;
      LOCK();
      bVar16 = (paVar1->_M_base)._M_i == false;
      if (bVar16) {
        (paVar1->_M_base)._M_i = true;
      }
      UNLOCK();
      peVar8 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (bVar16) {
        if ((peVar8 != (element_type *)0x0) && (iVar11 = (*peVar8->_vptr_logger[7])(), 3 < iVar11))
        {
          peVar8 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_((string *)&param,"[PRE-VOTE DONE] initiate actual vote");
          (*peVar8->_vptr_logger[8])
                    (peVar8,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                     ,"handle_prevote_resp",0x1e7,&param);
          if ((void **)CONCAT44(param.leaderId,param.myId) != &param.ctx) {
            operator_delete((undefined1 *)CONCAT44(param.leaderId,param.myId));
          }
        }
        initiate_vote(this,false);
        if ((this->role_)._M_i != leader) {
          restart_election_timer(this);
        }
      }
      else if ((peVar8 != (element_type *)0x0) &&
              (iVar11 = (*peVar8->_vptr_logger[7])(), 3 < iVar11)) {
        peVar8 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)&param,"[PRE-VOTE DONE] actual vote is already initiated, do nothing");
        (*peVar8->_vptr_logger[8])
                  (peVar8,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                   ,"handle_prevote_resp",0x1f2,&param);
        if ((void **)CONCAT44(param.leaderId,param.myId) != &param.ctx) {
          operator_delete((undefined1 *)CONCAT44(param.leaderId,param.myId));
        }
      }
    }
    if (iVar10 < (this->pre_vote_).live_.super___atomic_base<int>._M_i) {
      LOCK();
      paVar2 = &(this->pre_vote_).quorum_reject_count_;
      (paVar2->super___atomic_base<int>)._M_i = (paVar2->super___atomic_base<int>)._M_i + 1;
      UNLOCK();
      peVar8 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar8 != (element_type *)0x0) && (iVar11 = (*peVar8->_vptr_logger[7])(), 2 < iVar11)) {
        peVar8 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)&param,"[PRE-VOTE] rejected by quorum, count %d",
                   (ulong)(uint)(this->pre_vote_).quorum_reject_count_.super___atomic_base<int>._M_i
                  );
        (*peVar8->_vptr_logger[8])
                  (peVar8,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                   ,"handle_prevote_resp",0x1f9,&param);
        if ((void **)CONCAT44(param.leaderId,param.myId) != &param.ctx) {
          operator_delete((undefined1 *)CONCAT44(param.leaderId,param.myId));
        }
      }
      if (raft_limits_ <= (this->pre_vote_).quorum_reject_count_.super___atomic_base<int>._M_i) {
        peVar8 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar8 != (element_type *)0x0) && (iVar11 = (*peVar8->_vptr_logger[7])(), 0 < iVar11))
        {
          peVar8 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)&param,
                     "too many pre-vote rejections, probably this node is not receiving heartbeat from leader. we should re-establish the network connection"
                    );
          (*peVar8->_vptr_logger[8])
                    (peVar8,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                     ,"handle_prevote_resp",0x1fe,&param);
          if ((void **)CONCAT44(param.leaderId,param.myId) != &param.ctx) {
            operator_delete((undefined1 *)CONCAT44(param.leaderId,param.myId));
          }
        }
        send_reconnect_request(this);
      }
    }
    if (iVar10 < (this->pre_vote_).abandoned_.super___atomic_base<int>._M_i) {
      peVar8 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar8 != (element_type *)0x0) && (iVar11 = (*peVar8->_vptr_logger[7])(), 1 < iVar11)) {
        peVar8 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)&param,"[PRE-VOTE DONE] this node has been removed, stepping down");
        (*peVar8->_vptr_logger[8])
                  (peVar8,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                   ,"handle_prevote_resp",0x204,&param);
        if ((void **)CONCAT44(param.leaderId,param.myId) != &param.ctx) {
          operator_delete((undefined1 *)CONCAT44(param.leaderId,param.myId));
        }
      }
      param.myId = this->id_;
      param.leaderId = (this->leader_).super___atomic_base<int>._M_i;
      param.peerId = -1;
      param.ctx = (void *)0x0;
      pcVar9 = (this->ctx_)._M_t.
               super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>._M_t.
               super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>.
               super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl;
      if ((pcVar9->cb_func_).func.super__Function_base._M_manager != (_Manager_type)0x0) {
        local_34 = RemovedFromCluster;
        local_78 = &param;
        (*(pcVar9->cb_func_).func._M_invoker)((_Any_data *)&pcVar9->cb_func_,&local_34,&local_78);
      }
      this->steps_to_down_ = 2;
    }
  }
  else {
    peVar8 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar8 != (element_type *)0x0) && (iVar11 = (*peVar8->_vptr_logger[7])(), 3 < iVar11)) {
      peVar8 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar5 = (resp->super_msg_base).src_;
      sVar4 = (this->role_)._M_i;
      if (sVar4 == leader) {
        piVar13 = (int32_t *)((long)&local_68.leaderId + 2);
        local_68._0_6_ = 0x726500000000;
        local_68.myId = 0x6461656c;
        local_70 = 6;
      }
      else if (sVar4 == candidate) {
        piVar13 = (int32_t *)((long)&local_68.peerId + 1);
        local_68.myId = 0x646e6163;
        local_68.leaderId = 0x74616469;
        local_68.peerId._0_1_ = 0x65;
        local_70 = 9;
      }
      else if (sVar4 == follower) {
        piVar13 = &local_68.peerId;
        local_68.myId = 0x6c6c6f66;
        local_68.leaderId = 0x7265776f;
        local_70 = 8;
      }
      else {
        piVar13 = (int32_t *)((long)&local_68.leaderId + 3);
        local_68._0_7_ = 0x4e574f4e000000;
        local_68.myId = 0x4e4b4e55;
        local_70 = 7;
      }
      *(undefined1 *)piVar13 = 0;
      local_78 = &local_68;
      msg_if_given_abi_cxx11_
                ((string *)&param,
                 "[PRE-VOTE RESP] from peer %d, my role %s, but different resp term %lu (pre-vote term %lu). ignore it."
                 ,(ulong)uVar5,&local_68,(resp->super_msg_base).term_,(this->pre_vote_).term_);
      (*peVar8->_vptr_logger[8])
                (peVar8,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_vote.cxx"
                 ,"handle_prevote_resp",0x1c4,&param);
      if ((void **)CONCAT44(param.leaderId,param.myId) != &param.ctx) {
        operator_delete((undefined1 *)CONCAT44(param.leaderId,param.myId));
      }
      if (local_78 != &local_68) {
        operator_delete(local_78);
      }
    }
  }
  return;
}

Assistant:

void raft_server::handle_prevote_resp(resp_msg& resp) {
    if (resp.get_term() != pre_vote_.term_) {
        // Vote response for other term. Should ignore it.
        p_in("[PRE-VOTE RESP] from peer %d, my role %s, "
             "but different resp term %" PRIu64 " (pre-vote term %" PRIu64 "). "
             "ignore it.",
             resp.get_src(), srv_role_to_string(role_).c_str(),
             resp.get_term(), pre_vote_.term_);
        return;
    }

    if (resp.get_accepted()) {
        // Accept: means that this peer is not receiving HB.
        pre_vote_.dead_++;
    } else {
        if (resp.get_next_idx() != std::numeric_limits<ulong>::max()) {
            // Deny: means that this peer still sees leader.
            pre_vote_.live_++;
        } else {
            // `next_idx_for_resp == MAX`, it is a special signal
            // indicating that this node has been already removed.
            pre_vote_.abandoned_++;
        }
    }

    int32 election_quorum_size = get_quorum_for_election() + 1;

    p_in("[PRE-VOTE RESP] peer %d (%s), term %" PRIu64 ", resp term %" PRIu64 ", "
         "my role %s, dead %d, live %d, abandoned %d, "
         "num voting members %d, quorum %d\n",
         resp.get_src(), (resp.get_accepted())?"O":"X",
         pre_vote_.term_, resp.get_term(),
         srv_role_to_string(role_).c_str(),
         pre_vote_.dead_.load(), pre_vote_.live_.load(), pre_vote_.abandoned_.load(),
         get_num_voting_members(), election_quorum_size);

    if (pre_vote_.dead_ >= election_quorum_size) {
        p_in("[PRE-VOTE DONE] SUCCESS, term %" PRIu64, pre_vote_.term_);

        bool exp = false;
        bool val = true;
        if (pre_vote_.done_.compare_exchange_strong(exp, val)) {
            p_in("[PRE-VOTE DONE] initiate actual vote");

            // Immediately initiate actual vote.
            initiate_vote();

            // restart the election timer if this is not yet a leader
            if (role_ != srv_role::leader) {
                restart_election_timer();
            }

        } else {
            p_in("[PRE-VOTE DONE] actual vote is already initiated, do nothing");
        }
    }

    if (pre_vote_.live_ >= election_quorum_size) {
        pre_vote_.quorum_reject_count_.fetch_add(1);
        p_wn("[PRE-VOTE] rejected by quorum, count %d",
             pre_vote_.quorum_reject_count_.load());
        if ( pre_vote_.quorum_reject_count_ >=
                 raft_server::raft_limits_.pre_vote_rejection_limit_ ) {
            p_ft("too many pre-vote rejections, probably this node is not "
                 "receiving heartbeat from leader. "
                 "we should re-establish the network connection");
            send_reconnect_request();
        }
    }

    if (pre_vote_.abandoned_ >= election_quorum_size) {
        p_er("[PRE-VOTE DONE] this node has been removed, stepping down");
        cb_func::Param param(id_, leader_);
        CbReturnCode rc = ctx_->cb_func_.call( cb_func::RemovedFromCluster,
                                               &param );
        (void)rc;
        steps_to_down_ = 2;
    }
}